

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.h
# Opt level: O3

void __thiscall fmp4_stream::tfhd::tfhd(tfhd *this)

{
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  (this->super_full_box).super_box.size_ = 0;
  (this->super_full_box).super_box.large_size_ = 0;
  (this->super_full_box).super_box.box_type_._M_dataplus._M_p =
       (pointer)&(this->super_full_box).super_box.box_type_.field_2;
  (this->super_full_box).super_box.box_type_._M_string_length = 0;
  (this->super_full_box).super_box.box_type_.field_2._M_local_buf[0] = '\0';
  (this->super_full_box).super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_full_box).super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->super_full_box).super_box.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->super_full_box).super_box.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (this->super_full_box).super_box.field_0x62 = 0;
  *(undefined8 *)&(this->super_full_box).super_box.field_0x64 = 0;
  (this->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_00128498;
  *(undefined4 *)&(this->super_full_box).field_0x6c = 0;
  *(undefined4 *)&(this->super_full_box).field_0x6f = 0;
  *(undefined8 *)&this->track_id_ = 0;
  *(undefined8 *)((long)&this->base_data_offset_ + 4) = 0;
  this->sample_description_index_ = 0;
  this->default_sample_duration_ = 0;
  this->default_sample_size_ = 0;
  this->default_sample_flags_ = 0;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"tfhd","");
  std::__cxx11::string::operator=
            ((string *)&(this->super_full_box).super_box.box_type_,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

void set_zero() 
		{
			base_data_offset_present_=false;
			sample_description_index_present_=false;
			default_sample_duration_present_=false;
			default_sample_size_present_=false;
			default_sample_flags_present_=false;
			duration_is_empty_=false;
			default_base_is_moof_=false;

			track_id_=0;
			base_data_offset_=0;
			sample_description_index_=0;
			default_sample_duration_=0;
			default_sample_size_=0;
			default_sample_flags_=0;
		}